

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NeuralNetworkClassifier::SerializeWithCachedSizes
          (NeuralNetworkClassifier *this,CodedOutputStream *output)

{
  int iVar1;
  string *psVar2;
  size_type sVar3;
  uint32 uVar4;
  Type *value;
  Type *value_00;
  int iVar5;
  
  iVar1 = (this->layers_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (&(this->layers_).super_RepeatedPtrFieldBase,iVar5);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  iVar1 = (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar5 = 0; iVar1 != iVar5; iVar5 = iVar5 + 1) {
    value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
                         (&(this->preprocessing_).super_RepeatedPtrFieldBase,iVar5);
    google::protobuf::internal::WireFormatLite::WriteMessage(2,&value_00->super_MessageLite,output);
  }
  if (this->arrayinputshapemapping_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(5,this->arrayinputshapemapping_,output);
  }
  if (this->imageinputshapemapping_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(6,this->imageinputshapemapping_,output);
  }
  if (this->updateparams_ != (NetworkUpdateParameters *)0x0 &&
      this != (NeuralNetworkClassifier *)&_NeuralNetworkClassifier_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&this->updateparams_->super_MessageLite,output);
  }
  uVar4 = this->_oneof_case_[0];
  if (uVar4 == 100) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (100,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
    uVar4 = this->_oneof_case_[0];
  }
  if (uVar4 == 0x65) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x65,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
  }
  psVar2 = (this->labelprobabilitylayername_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.NeuralNetworkClassifier.labelProbabilityLayerName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (200,(this->labelprobabilitylayername_).ptr_,output);
    return;
  }
  return;
}

Assistant:

void NeuralNetworkClassifier::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.NeuralNetworkClassifier)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
  for (unsigned int i = 0, n = this->layers_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->layers(i), output);
  }

  // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
  for (unsigned int i = 0, n = this->preprocessing_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, this->preprocessing(i), output);
  }

  // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
  if (this->arrayinputshapemapping() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      5, this->arrayinputshapemapping(), output);
  }

  // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
  if (this->imageinputshapemapping() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      6, this->imageinputshapemapping(), output);
  }

  // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
  if (this->has_updateparams()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *this->updateparams_, output);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 100;
  if (has_stringclasslabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      100, *ClassLabels_.stringclasslabels_, output);
  }

  // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
  if (has_int64classlabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      101, *ClassLabels_.int64classlabels_, output);
  }

  // string labelProbabilityLayerName = 200;
  if (this->labelprobabilitylayername().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->labelprobabilitylayername().data(), this->labelprobabilitylayername().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.NeuralNetworkClassifier.labelProbabilityLayerName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      200, this->labelprobabilitylayername(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.NeuralNetworkClassifier)
}